

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O0

void __thiscall rtosc::ThreadLink::~ThreadLink(ThreadLink *this)

{
  long in_RDI;
  
  if ((void *)**(undefined8 **)(in_RDI + 0x20) != (void *)0x0) {
    operator_delete__((void *)**(undefined8 **)(in_RDI + 0x20));
  }
  if (*(void **)(in_RDI + 0x20) != (void *)0x0) {
    operator_delete(*(void **)(in_RDI + 0x20),0x28);
  }
  if (*(void **)(in_RDI + 0x10) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x10));
  }
  if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x18));
  }
  return;
}

Assistant:

ThreadLink::~ThreadLink(void)
{
    delete[] ring->buffer;
    delete   ring;
    delete[] write_buffer;
    delete[] read_buffer;
}